

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

IndirOpnd * __thiscall
Func::GetConstantAddressIndirOpnd
          (Func *this,intptr_t address,Opnd *largeConstOpnd,AddrOpndKind kind,IRType type,
          OpCode loadOpCode)

{
  code *pcVar1;
  anon_class_16_2_42acc856 predicate;
  bool bVar2;
  Func *pFVar3;
  undefined4 *puVar4;
  Instr *instr;
  IndirOpnd *indirOpnd;
  Instr *insertBeforeInstr;
  Instr *newInstr;
  RegOpnd *addressRegOpnd;
  RegOpnd ***local_40;
  Type *local_38;
  RegOpnd **foundRegOpnd;
  int offset;
  OpCode loadOpCode_local;
  IRType type_local;
  AddrOpndKind kind_local;
  Opnd *largeConstOpnd_local;
  intptr_t address_local;
  Func *this_local;
  
  foundRegOpnd._4_2_ = loadOpCode;
  foundRegOpnd._6_1_ = type;
  foundRegOpnd._7_1_ = kind;
  _offset = largeConstOpnd;
  largeConstOpnd_local = (Opnd *)address;
  address_local = (intptr_t)this;
  pFVar3 = GetTopFunc(this);
  if (pFVar3 != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7a4,"(this->GetTopFunc() == this)","this->GetTopFunc() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->canHoistConstantAddressLoad & 1U) == 0) {
    this_local = (Func *)0x0;
  }
  else {
    foundRegOpnd._0_4_ = 0;
    addressRegOpnd = (RegOpnd *)largeConstOpnd_local;
    local_40 = &foundRegOpnd;
    predicate.offset = (int *)local_40;
    predicate.address = (intptr_t)largeConstOpnd_local;
    local_38 = SListBase<IR::RegOpnd*,Memory::ArenaAllocator,RealCount>::
               Find<Func::GetConstantAddressIndirOpnd(long,IR::Opnd*,IR::AddrOpndKind,IRType,Js::OpCode)::__0>
                         ((SListBase<IR::RegOpnd*,Memory::ArenaAllocator,RealCount> *)
                          &this->constantAddressRegOpnd,predicate);
    if (local_38 == (Type *)0x0) {
      if ((int)foundRegOpnd != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x7c4,"(offset == 0)","offset == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      newInstr = (Instr *)IR::RegOpnd::New(TyUint64,this);
      instr = IR::Instr::New(foundRegOpnd._4_2_,(Opnd *)newInstr,_offset,this);
      SList<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                (&this->constantAddressRegOpnd,(RegOpnd **)&newInstr);
      indirOpnd = (IndirOpnd *)this->lastConstantAddressRegLoadInstr;
      if ((Instr *)indirOpnd == (Instr *)0x0) {
        indirOpnd = (IndirOpnd *)GetFunctionEntryInsertionPoint(this);
        this->lastConstantAddressRegLoadInstr = instr;
      }
      IR::Instr::InsertBefore((Instr *)indirOpnd,instr);
    }
    else {
      newInstr = (Instr *)*local_38;
    }
    pFVar3 = (Func *)IR::IndirOpnd::New((RegOpnd *)newInstr,(int)foundRegOpnd,foundRegOpnd._6_1_,
                                        this,true);
    IR::IndirOpnd::SetAddrKind((IndirOpnd *)pFVar3,foundRegOpnd._7_1_,largeConstOpnd_local);
    this_local = pFVar3;
  }
  return (IndirOpnd *)this_local;
}

Assistant:

IR::IndirOpnd * Func::GetConstantAddressIndirOpnd(intptr_t address, IR::Opnd * largeConstOpnd, IR::AddrOpndKind kind, IRType type, Js::OpCode loadOpCode)
{
    Assert(this->GetTopFunc() == this);
    if (!canHoistConstantAddressLoad)
    {
        // We can't hoist constant address load after lower, as we can't mark the sym as
        // live on back edge
        return nullptr;
    }
    int offset = 0;
    IR::RegOpnd ** foundRegOpnd = this->constantAddressRegOpnd.Find([address, &offset](IR::RegOpnd * regOpnd)
    {
        Assert(regOpnd->m_sym->IsSingleDef());
        Assert(regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() || regOpnd->m_sym->m_instrDef->GetSrc1()->IsIntConstOpnd());
        void * curr = regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() ?
                      regOpnd->m_sym->m_instrDef->GetSrc1()->AsAddrOpnd()->m_address :
                      (void *)regOpnd->m_sym->m_instrDef->GetSrc1()->AsIntConstOpnd()->GetValue();
        ptrdiff_t diff = (uintptr_t)address - (uintptr_t)curr;
        if (!Math::FitsInDWord(diff))
        {
            return false;
        }

        offset = (int)diff;
        return true;
    });

    IR::RegOpnd * addressRegOpnd;
    if (foundRegOpnd != nullptr)
    {
        addressRegOpnd = *foundRegOpnd;
    }
    else
    {
        Assert(offset == 0);
        addressRegOpnd = IR::RegOpnd::New(TyMachPtr, this);
        IR::Instr *const newInstr =
            IR::Instr::New(
            loadOpCode,
            addressRegOpnd,
            largeConstOpnd,
            this);
        this->constantAddressRegOpnd.Prepend(addressRegOpnd);

        IR::Instr * insertBeforeInstr = this->lastConstantAddressRegLoadInstr;
        if (insertBeforeInstr == nullptr)
        {
            insertBeforeInstr = this->GetFunctionEntryInsertionPoint();
            this->lastConstantAddressRegLoadInstr = newInstr;
        }
        insertBeforeInstr->InsertBefore(newInstr);
    }
    IR::IndirOpnd * indirOpnd =  IR::IndirOpnd::New(addressRegOpnd, offset, type, this, true);
#if DBG_DUMP
    // TODO: michhol make intptr_t
    indirOpnd->SetAddrKind(kind, (void*)address);
#endif
    return indirOpnd;
}